

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

void Js::JavascriptOperators::OP_InitForInEnumerator
               (Var enumerable,ForInObjectEnumerator *enumerator,ScriptContext *scriptContext,
               EnumeratorCache *forInCache)

{
  BOOL BVar1;
  RecyclableObject *local_30;
  RecyclableObject *enumerableObject;
  
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(enumerable);
  BVar1 = GetPropertyObject(enumerable,scriptContext,&local_30);
  if (BVar1 == 0) {
    local_30 = (RecyclableObject *)0x0;
  }
  ForInObjectEnumerator::Initialize(enumerator,local_30,scriptContext,false,forInCache);
  return;
}

Assistant:

void JavascriptOperators::OP_InitForInEnumerator(Var enumerable, ForInObjectEnumerator * enumerator, ScriptContext* scriptContext, EnumeratorCache * forInCache)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_OP_InitForInEnumerator);
        RecyclableObject* enumerableObject;
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(enumerable);
#endif
        if (!GetPropertyObject(enumerable, scriptContext, &enumerableObject))
        {
            enumerableObject = nullptr;
        }

        enumerator->Initialize(enumerableObject, scriptContext, false, forInCache);
        JIT_HELPER_END(Op_OP_InitForInEnumerator);
    }